

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printbitfield(rnnbitfield *bf,int shift)

{
  int in_ESI;
  char *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x30) == 0) {
    if (*(int *)(in_RDI + 0x60) == 9) {
      printdef((char *)bf,(char *)CONCAT44(shift,in_stack_00000008),unaff_retaddr_00,
               (uint64_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    else {
      printdef((char *)bf,(char *)CONCAT44(shift,in_stack_00000008),unaff_retaddr_00,
               (uint64_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      printdef((char *)bf,(char *)CONCAT44(shift,in_stack_00000008),unaff_retaddr_00,
               (uint64_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    printtypeinfo((rnntypeinfo *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,in_ESI,
                  in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void printbitfield (struct rnnbitfield *bf, int shift) {
	if (bf->varinfo.dead)
		return;
	if (bf->typeinfo.type == RNN_TTYPE_BOOLEAN) {
		printdef (bf->fullname, 0, 0, bf->mask << shift, bf->file);
	} else {
		printdef (bf->fullname, "MASK", 0, bf->mask << shift, bf->file);
		printdef (bf->fullname, "SHIFT", 1, bf->low + shift, bf->file);
	}
	printtypeinfo (&bf->typeinfo, bf->fullname, bf->low + shift, bf->file);
}